

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_LdCustomSpreadIteratorList(Var aRight,ScriptContext *scriptContext)

{
  uint32 uVar1;
  anon_class_24_3_32208331 implicitCall;
  Var iterator;
  JavascriptMethod p_Var2;
  ScriptContext *iterator_00;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  BOOL BVar6;
  JavascriptLibrary *pJVar7;
  JavascriptArray *pJVar8;
  SparseArraySegmentBase *pSVar9;
  SparseArraySegmentBase **ppSVar10;
  JavascriptMethod p_Var11;
  Recycler *pRVar12;
  SpreadArgument *pSVar13;
  DynamicType *pDVar14;
  TrackAllocData local_b8;
  ThreadContext *local_90;
  JavascriptMethod local_88;
  ScriptContext *local_80;
  Var local_78;
  Var iteratorVar;
  ThreadContext *threadContext;
  undefined8 local_60;
  TrackAllocData local_58;
  JavascriptMethod local_30;
  JavascriptMethod method;
  RecyclableObject *function;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  
  function = (RecyclableObject *)scriptContext;
  scriptContext_local = (ScriptContext *)aRight;
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(aRight);
  pJVar7 = ScriptContext::GetLibrary((ScriptContext *)function);
  JavascriptLibrary::EnsureArrayBuiltInsAreReady(pJVar7);
  method = (JavascriptMethod)
           GetIteratorFunction(scriptContext_local,(ScriptContext *)function,false);
  local_30 = RecyclableObject::GetEntryPoint((RecyclableObject *)method);
  bVar3 = Js::JavascriptArray::IsNonES5Array(scriptContext_local);
  if ((bVar3) &&
     (bVar3 = JavascriptLibrary::IsDefaultArrayValuesFunction
                        ((RecyclableObject *)method,(ScriptContext *)function), bVar3)) {
    pJVar8 = UnsafeVarTo<Js::JavascriptArray>(scriptContext_local);
    pSVar9 = Js::JavascriptArray::GetHead(pJVar8);
    ppSVar10 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                         ((WriteBarrierPtr *)&pSVar9->next);
    if (*ppSVar10 != (SparseArraySegmentBase *)0x0) goto LAB_00f90fd6;
    pJVar8 = UnsafeVarTo<Js::JavascriptArray>(scriptContext_local);
    pSVar9 = Js::JavascriptArray::GetHead(pJVar8);
    if (pSVar9->left != 0) goto LAB_00f90fd6;
    pJVar8 = UnsafeVarTo<Js::JavascriptArray>(scriptContext_local);
    pSVar9 = Js::JavascriptArray::GetHead(pJVar8);
    uVar1 = pSVar9->length;
    pJVar8 = VarTo<Js::JavascriptArray>(scriptContext_local);
    uVar4 = ArrayObject::GetLength(&pJVar8->super_ArrayObject);
    if (uVar1 != uVar4) goto LAB_00f90fd6;
    pJVar8 = UnsafeVarTo<Js::JavascriptArray>(scriptContext_local);
    bVar3 = Js::JavascriptArray::HasNoMissingValues(pJVar8);
    if (!bVar3) goto LAB_00f90fd6;
    pJVar8 = UnsafeVarTo<Js::JavascriptArray>(scriptContext_local);
    iVar5 = (*(pJVar8->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x66])();
    if (iVar5 != 0) goto LAB_00f90fd6;
  }
  else {
LAB_00f90fd6:
    bVar3 = VarIs<Js::TypedArrayBase>(scriptContext_local);
    p_Var2 = local_30;
    if ((!bVar3) ||
       (p_Var11 = FunctionInfo::GetOriginalEntryPoint
                            ((FunctionInfo *)Js::TypedArrayBase::EntryInfo::Values),
       p_Var2 != p_Var11)) goto LAB_00f910eb;
  }
  bVar3 = JavascriptLibrary::ArrayIteratorPrototypeHasUserDefinedNext((ScriptContext *)function);
  if (!bVar3) {
    pRVar12 = ScriptContext::GetRecycler((ScriptContext *)function);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&SpreadArgument::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
               ,0x635);
    pRVar12 = Memory::Recycler::TrackAllocInfo(pRVar12,&local_58);
    threadContext = (ThreadContext *)Memory::Recycler::AllocInlined;
    local_60 = 0;
    pSVar13 = (SpreadArgument *)new<Memory::Recycler>(0x28,pRVar12,0x43c4b0);
    iterator_00 = scriptContext_local;
    pJVar7 = ScriptContext::GetLibrary((ScriptContext *)function);
    pDVar14 = JavascriptLibrary::GetSpreadArgumentType(pJVar7);
    SpreadArgument::SpreadArgument(pSVar13,iterator_00,true,pDVar14);
    return pSVar13;
  }
LAB_00f910eb:
  local_90 = ScriptContext::GetThreadContext((ScriptContext *)function);
  local_88 = method;
  local_80 = scriptContext_local;
  implicitCall.function = (RecyclableObject *)method;
  implicitCall.threadContext = local_90;
  implicitCall.aRight = scriptContext_local;
  iteratorVar = local_90;
  local_78 = ThreadContext::
             ExecuteImplicitCall<Js::JavascriptOperators::OP_LdCustomSpreadIteratorList(void*,Js::ScriptContext*)::__0>
                       (local_90,(RecyclableObject *)method,ImplicitCall_Accessor,implicitCall);
  BVar6 = IsObject(local_78);
  if (BVar6 == 0) {
    bVar3 = ThreadContext::RecordImplicitException((ThreadContext *)iteratorVar);
    if (bVar3) {
      JavascriptError::ThrowTypeError((ScriptContext *)function,-0x7ff5ec71,(PCWSTR)0x0);
    }
    pJVar7 = ScriptContext::GetLibrary((ScriptContext *)function);
    aRight_local = JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
  }
  else {
    pRVar12 = ScriptContext::GetRecycler((ScriptContext *)function);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_b8,(type_info *)&SpreadArgument::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
               ,0x649);
    pRVar12 = Memory::Recycler::TrackAllocInfo(pRVar12,&local_b8);
    pSVar13 = (SpreadArgument *)new<Memory::Recycler>(0x28,pRVar12,0x43c4b0);
    iterator = local_78;
    pJVar7 = ScriptContext::GetLibrary((ScriptContext *)function);
    pDVar14 = JavascriptLibrary::GetSpreadArgumentType(pJVar7);
    SpreadArgument::SpreadArgument(pSVar13,iterator,false,pDVar14);
    aRight_local = pSVar13;
  }
  return aRight_local;
}

Assistant:

Var JavascriptOperators::OP_LdCustomSpreadIteratorList(Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_ToSpreadedFunctionArgument);
#if ENABLE_COPYONACCESS_ARRAY
        // We know we're going to read from this array. Do the conversion before we try to perform checks on the head segment.
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray(aRight);
#endif

#ifdef ENABLE_JS_BUILTINS
        scriptContext->GetLibrary()->EnsureArrayBuiltInsAreReady();
#endif

        RecyclableObject* function = GetIteratorFunction(aRight, scriptContext);
        JavascriptMethod method = function->GetEntryPoint();
        if (((JavascriptArray::IsNonES5Array(aRight) &&
              (
                  JavascriptLibrary::IsDefaultArrayValuesFunction(function, scriptContext)
                  // Verify that the head segment of the array covers all elements with no gaps.
                  // Accessing an element on the prototype could have side-effects that would invalidate the optimization.
                  && UnsafeVarTo<JavascriptArray>(aRight)->GetHead()->next == nullptr
                  && UnsafeVarTo<JavascriptArray>(aRight)->GetHead()->left == 0
                  && UnsafeVarTo<JavascriptArray>(aRight)->GetHead()->length == VarTo<JavascriptArray>(aRight)->GetLength()
                  && UnsafeVarTo<JavascriptArray>(aRight)->HasNoMissingValues()
                  && !UnsafeVarTo<JavascriptArray>(aRight)->IsCrossSiteObject()
              )) ||
             (VarIs<TypedArrayBase>(aRight) && method == TypedArrayBase::EntryInfo::Values.GetOriginalEntryPoint()))
            // We can't optimize away the iterator if the array iterator prototype is user defined.
            && !JavascriptLibrary::ArrayIteratorPrototypeHasUserDefinedNext(scriptContext))
        {
            return RecyclerNew(scriptContext->GetRecycler(), SpreadArgument, aRight, true /*useDirectCall*/, scriptContext->GetLibrary()->GetSpreadArgumentType());
        }

        ThreadContext *threadContext = scriptContext->GetThreadContext();

        Var iteratorVar =
            threadContext->ExecuteImplicitCall(function, ImplicitCall_Accessor, [=]() -> Var
            {
                return CALL_FUNCTION(threadContext, function, CallInfo(Js::CallFlags_Value, 1), aRight);
            });

        if (!JavascriptOperators::IsObject(iteratorVar))
        {
            if (!threadContext->RecordImplicitException())
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
        }

        return RecyclerNew(scriptContext->GetRecycler(), SpreadArgument, iteratorVar, false /*useDirectCall*/, scriptContext->GetLibrary()->GetSpreadArgumentType());
        JIT_HELPER_END(Op_ToSpreadedFunctionArgument);
    }